

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_descriptor.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* program_options::(anonymous_namespace)::tokenize_abi_cxx11_(char *input,char *separators)

{
  char *in_RDX;
  char *in_RSI;
  set<char,_std::less<char>,_std::allocator<char>_> *in_RDI;
  bool prevSeparator;
  set<char,_std::less<char>,_std::allocator<char>_> sep;
  size_t len;
  char *start;
  char *ptr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result;
  char **in_stack_ffffffffffffff70;
  set<char,_std::less<char>,_std::allocator<char>_> *this;
  undefined4 in_stack_ffffffffffffff88;
  uint uVar1;
  undefined4 in_stack_ffffffffffffff8c;
  set<char,_std::less<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  char *local_28;
  char *local_20;
  
  this = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x126160);
  strlen(in_RDX);
  std::set<char,std::less<char>,std::allocator<char>>::set<char_const*>
            (in_stack_ffffffffffffff90,
             (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),(char *)this);
  uVar1 = 0;
  local_28 = in_RSI;
  for (local_20 = in_RSI; *local_20 != '\0'; local_20 = local_20 + 1) {
    in_stack_ffffffffffffff70 =
         (char **)std::set<char,_std::less<char>,_std::allocator<char>_>::count
                            (this,(key_type *)in_RDI);
    if (in_stack_ffffffffffffff70 == (char **)0x0) {
      uVar1 = 0;
    }
    else {
      if ((uVar1 & 0x1000000) == 0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*&,char_const*&>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this,(char **)in_RDI,in_stack_ffffffffffffff70);
        uVar1 = 0x1000000;
      }
      local_28 = local_20;
    }
  }
  if (local_28 != local_20) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*&,char_const*&>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this,(char **)in_RDI,in_stack_ffffffffffffff70);
  }
  std::set<char,_std::less<char>,_std::allocator<char>_>::~set
            ((set<char,_std::less<char>,_std::allocator<char>_> *)0x12626d);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this;
}

Assistant:

std::vector<std::string> tokenize(const char* input, const char* separators)
{
    const char* ptr = input;
    const char* start = input;
    std::vector<std::string> result;
    size_t len = strlen(separators);
    std::set<char> sep(separators, separators+len);

    bool prevSeparator = false;

    while(*ptr) {
        if (sep.count(*ptr)) {
            if (!prevSeparator) {
                result.emplace_back(start, ptr);
                prevSeparator = true;
            }
            start = ptr;
        } else {
            prevSeparator = false;
        }
        ptr++;
    }
    // There is some leftover.
    if (start != ptr) {
        result.emplace_back(start, ptr);
    }
    return result;
}